

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O0

void __thiscall MyCompiler::AbstractAstNode::AbstractAstNode(AbstractAstNode *this,string *name)

{
  int iVar1;
  string *name_local;
  AbstractAstNode *this_local;
  
  iVar1 = counter + 1;
  this->id = counter;
  counter = iVar1;
  this->caseNum = 0;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  std::__cxx11::string::string((string *)&this->value);
  return;
}

Assistant:

MyCompiler::AbstractAstNode::AbstractAstNode(std::string name)
        : id(counter++), name(std::move(name))
{}